

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          ProgramInterface *program_interface,STAGES stage)

{
  Variable *pVVar1;
  bool bVar2;
  ShaderInterface *pSVar3;
  pointer ppVVar4;
  ulong uVar5;
  char *__end;
  ulong uVar6;
  string verification;
  size_t position;
  string local_b0;
  string local_90;
  FLAVOUR local_6c;
  string local_68;
  size_t local_48;
  TextureTestBase *local_40;
  string *local_38;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_40 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"if (LIST)\n    {\n        result = 0u;\n    }\n","");
  local_6c = BASIC;
  if (stage - TESS_CTRL < 3) {
    local_6c = *(FLAVOUR *)(&DAT_01a43240 + (ulong)(stage - TESS_CTRL) * 4);
  }
  pSVar3 = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  if ((((pSVar3->m_inputs).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pSVar3->m_inputs).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_start) &&
      ((pSVar3->m_uniforms).
       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (pSVar3->m_uniforms).
       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
       ._M_impl.super__Vector_impl_data._M_start)) &&
     ((pSVar3->m_ssb_blocks).
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pSVar3->m_ssb_blocks).
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1b32ab9);
  }
  else {
    local_48 = 0;
    ppVVar4 = (pSVar3->m_inputs).
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_38 = __return_storage_ptr__;
    if ((pSVar3->m_inputs).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pVVar1 = ppVVar4[uVar5];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,0x1b32ab9,0x1b32ab9);
        getVariableVerifcation
                  (&local_b0,local_40,&local_68,pVVar1->m_data,&pVVar1->m_descriptor,local_6c);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        Utils::insertElementOfList(local_b0._M_dataplus._M_p," ||\n        ",&local_48,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        ppVVar4 = (pSVar3->m_inputs).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar6 < (ulong)((long)(pSVar3->m_inputs).
                                      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >>
                               3);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    ppVVar4 = (pSVar3->m_uniforms).
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pSVar3->m_uniforms).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pVVar1 = ppVVar4[uVar5];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,0x1b32ab9,0x1b32ab9);
        getVariableVerifcation
                  (&local_b0,local_40,&local_68,pVVar1->m_data,&pVVar1->m_descriptor,BASIC);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        Utils::insertElementOfList(local_b0._M_dataplus._M_p," ||\n        ",&local_48,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        ppVVar4 = (pSVar3->m_uniforms).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar6 < (ulong)((long)(pSVar3->m_uniforms).
                                      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >>
                               3);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    ppVVar4 = (pSVar3->m_ssb_blocks).
              super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((pSVar3->m_ssb_blocks).
        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppVVar4) {
      uVar5 = 0;
      uVar6 = 1;
      do {
        pVVar1 = ppVVar4[uVar5];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,0x1b32ab9,0x1b32ab9);
        getVariableVerifcation
                  (&local_b0,local_40,&local_68,pVVar1->m_data,&pVVar1->m_descriptor,BASIC);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        Utils::insertElementOfList(local_b0._M_dataplus._M_p," ||\n        ",&local_48,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        ppVVar4 = (pSVar3->m_ssb_blocks).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar6 < (ulong)((long)(pSVar3->m_ssb_blocks).
                                      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4 >>
                               3);
        uVar5 = uVar6;
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (bVar2);
    }
    Utils::endList(glcts::fixed_sample_locations_values + 1,&local_48,&local_90);
    (local_38->_M_dataplus)._M_p = (pointer)&local_38->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      (local_38->field_2)._M_allocated_capacity =
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_38->field_2 + 8) = local_90.field_2._8_8_;
    }
    else {
      (local_38->_M_dataplus)._M_p = local_90._M_dataplus._M_p;
      (local_38->field_2)._M_allocated_capacity =
           CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    }
    local_38->_M_string_length = local_90._M_string_length;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__ = local_38;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getVerificationSnippet(GLuint /* test_case_index */,
													Utils::ProgramInterface& program_interface,
													Utils::Shader::STAGES	stage)
{
	static const GLchar* separator = " ||\n        ";

	std::string verification = "if (LIST)\n"
							   "    {\n"
							   "        result = 0u;\n"
							   "    }\n";

	/* Get flavour of in and out variables */
	Utils::Variable::FLAVOUR in_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);

	/* Get interface for shader stage */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(stage);

	/* There are no varialbes to verify */
	if ((0 == si.m_inputs.size()) && (0 == si.m_uniforms.size()) && (0 == si.m_ssb_blocks.size()))
	{
		return "";
	}

	/* For each in variable insert verification code */
	size_t position = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		const Utils::Variable& var				= *si.m_inputs[i];
		const std::string&	 var_verification = getVariableVerifcation("", var.m_data, var.m_descriptor, in_flavour);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each unifrom variable insert verification code */
	for (GLuint i = 0; i < si.m_uniforms.size(); ++i)
	{
		const Utils::Variable& var = *si.m_uniforms[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each ssb variable insert verification code */
	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		const Utils::Variable& var = *si.m_ssb_blocks[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	Utils::endList("", position, verification);

#if DEBUG_TTB_VERIFICATION_SNIPPET_STAGE

	{
		GLchar buffer[16];
		sprintf(buffer, "%d", stage + 10);
		Utils::replaceToken("0u", position, buffer, verification);
	}

#elif DEBUG_TTB_VERIFICATION_SNIPPET_VARIABLE

	if (Utils::Shader::VERTEX == stage)
	{
		Utils::replaceToken("0u", position, "in_vs_first.x", verification);
	}
	else
	{
		Utils::replaceToken("0u", position, "31u", verification);
	}

#endif

	/* Done */
	return verification;
}